

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O0

bool __thiscall
density::
conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>_>
::empty(conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>_>
        *this)

{
  bool bVar1;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock;
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>_>
  *this_local;
  
  lock._M_device = &this->m_mutex;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->m_mutex);
  bVar1 = heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>_>
          ::empty(&this->m_queue);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return bVar1;
}

Assistant:

bool empty() const noexcept
        {
            std::lock_guard<std::mutex> lock(m_mutex);
            return m_queue.empty();
        }